

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoeffBasedProduct.h
# Opt level: O2

void __thiscall
Eigen::
CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,-1,1,false>const,6>
::
CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>>
          (CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>const,6>
           *this,Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>
                 *lhs,Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false> *rhs)

{
  Index IVar1;
  long lVar2;
  variable_if_dynamic<long,__1> *pvVar3;
  CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>const,6>
  *pCVar4;
  
  pvVar3 = (variable_if_dynamic<long,__1> *)lhs;
  pCVar4 = this;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(long *)pCVar4 = pvVar3->m_value;
    pvVar3 = pvVar3 + 1;
    pCVar4 = pCVar4 + 8;
  }
  lVar2 = (rhs->
          super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.
          m_rows.m_value;
  *(PointerType *)(this + 0x48) =
       (rhs->super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
       ).super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.
       m_data;
  *(long *)(this + 0x50) = lVar2;
  IVar1 = (rhs->
          super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
          m_outerStride;
  *(Nested *)(this + 0x60) =
       (rhs->super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
       ).super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.m_xpr
  ;
  *(Index *)(this + 0x68) = IVar1;
  *(undefined8 *)(this + 0x80) = 0;
  if ((lhs->
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      ).
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_0>
      .m_cols.m_value ==
      (rhs->super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>)
      .super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.
      m_rows.m_value) {
    return;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/products/CoeffBasedProduct.h"
                ,0x9e,
                "Eigen::CoeffBasedProduct<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, const Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>, 6>::CoeffBasedProduct(const Lhs &, const Rhs &) [Lhs = const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, Rhs = const Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>, NestingFlags = 6, Lhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>>>, Rhs = Eigen::Block<const Eigen::Matrix<double, 2, 2>, -1, 1>]"
               );
}

Assistant:

inline CoeffBasedProduct(const Lhs& lhs, const Rhs& rhs)
      : m_lhs(lhs), m_rhs(rhs)
    {
      // we don't allow taking products of matrices of different real types, as that wouldn't be vectorizable.
      // We still allow to mix T and complex<T>.
      EIGEN_STATIC_ASSERT((internal::scalar_product_traits<typename Lhs::RealScalar, typename Rhs::RealScalar>::Defined),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)
      eigen_assert(lhs.cols() == rhs.rows()
        && "invalid matrix product"
        && "if you wanted a coeff-wise or a dot product use the respective explicit functions");
    }